

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnRelocCount
          (BinaryReaderObjdump *this,Index count,Index section_index)

{
  pointer pBVar1;
  BinarySection BVar2;
  string_view sVar3;
  
  pBVar1 = (this->super_BinaryReaderObjdumpBase).section_types_.
           super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)section_index <
      (ulong)((long)(this->super_BinaryReaderObjdumpBase).section_types_.
                    super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 2)) {
    BVar2 = pBVar1[section_index];
  }
  else {
    Stream::Writef(&((this->super_BinaryReaderObjdumpBase).err_stream_._M_t.
                     super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                     .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
                   "invalid relocation section index: %u\n",(ulong)section_index);
    BVar2 = Invalid;
  }
  (this->super_BinaryReaderObjdumpBase).reloc_section_ = BVar2;
  sVar3 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->section_names,
                            section_index);
  PrintDetails(this,"  - relocations for section: %d (%.*s) [%d]\n",(ulong)section_index,
               (ulong)(uint)sVar3._M_len,sVar3._M_str,count);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnRelocCount(Index count, Index section_index) {
  BinaryReaderObjdumpBase::OnRelocCount(count, section_index);
  PrintDetails("  - relocations for section: %d (" PRIstringview ") [%d]\n",
               section_index,
               WABT_PRINTF_STRING_VIEW_ARG(GetSectionName(section_index)),
               count);
  return Result::Ok;
}